

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

LineTable * __thiscall
llvm::DWARFDebugLine::SectionParser::parseNext
          (LineTable *__return_storage_ptr__,SectionParser *this,
          function_ref<void_(llvm::Error)> RecoverableErrorCallback,
          function_ref<void_(llvm::Error)> UnrecoverableErrorCallback,raw_ostream *OS)

{
  uint64_t OldOffset_00;
  DWARFDataExtractor *OffsetPtr;
  DWARFUnit *U_00;
  bool bVar1;
  DWARFUnit *RecoverableErrorCallback_00;
  Error local_90 [3];
  undefined1 local_78 [32];
  undefined1 local_58 [8];
  Error Err;
  uint64_t OldOffset;
  DWARFUnit *U;
  SectionParser *this_local;
  function_ref<void_(llvm::Error)> UnrecoverableErrorCallback_local;
  function_ref<void_(llvm::Error)> RecoverableErrorCallback_local;
  LineTable *LT;
  
  UnrecoverableErrorCallback_local.callable = (intptr_t)RecoverableErrorCallback.callback;
  UnrecoverableErrorCallback_local.callback =
       (_func_void_intptr_t_Error *)UnrecoverableErrorCallback.callable;
  this_local = (SectionParser *)UnrecoverableErrorCallback.callback;
  bVar1 = DataExtractor::isValidOffset(&this->DebugLineData->super_DataExtractor,this->Offset);
  if (bVar1) {
    RecoverableErrorCallback_00 = prepareToParse(this,this->Offset);
    OldOffset_00 = this->Offset;
    Err.Payload._7_1_ = 0;
    LineTable::LineTable(__return_storage_ptr__);
    OffsetPtr = this->DebugLineData;
    U_00 = (DWARFUnit *)this->Context;
    std::function<void(llvm::Error)>::function<llvm::function_ref<void(llvm::Error)>&,void>
              ((function<void(llvm::Error)> *)local_78,
               (function_ref<void_(llvm::Error)> *)&UnrecoverableErrorCallback_local.callable);
    LineTable::parse((LineTable *)local_58,(DWARFDataExtractor *)__return_storage_ptr__,
                     (uint64_t *)OffsetPtr,(DWARFContext *)&this->Offset,U_00,
                     (function<void_(llvm::Error)> *)RecoverableErrorCallback_00,
                     (raw_ostream *)local_78);
    std::function<void_(llvm::Error)>::~function((function<void_(llvm::Error)> *)local_78);
    bVar1 = Error::operator_cast_to_bool((Error *)local_58);
    if (bVar1) {
      Error::Error(local_90,(Error *)local_58);
      function_ref<void_(llvm::Error)>::operator()
                ((function_ref<void_(llvm::Error)> *)&this_local,local_90);
      Error::~Error(local_90);
    }
    Error::~Error((Error *)local_58);
    moveToNextTable(this,OldOffset_00,&__return_storage_ptr__->Prologue);
    return __return_storage_ptr__;
  }
  __assert_fail("DebugLineData.isValidOffset(Offset) && \"parsing should have terminated\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                ,0x46f,
                "DWARFDebugLine::LineTable llvm::DWARFDebugLine::SectionParser::parseNext(function_ref<void (Error)>, function_ref<void (Error)>, raw_ostream *)"
               );
}

Assistant:

DWARFDebugLine::LineTable DWARFDebugLine::SectionParser::parseNext(
    function_ref<void(Error)> RecoverableErrorCallback,
    function_ref<void(Error)> UnrecoverableErrorCallback, raw_ostream *OS) {
  assert(DebugLineData.isValidOffset(Offset) &&
         "parsing should have terminated");
  DWARFUnit *U = prepareToParse(Offset);
  uint64_t OldOffset = Offset;
  LineTable LT;
  if (Error Err = LT.parse(DebugLineData, &Offset, Context, U,
                           RecoverableErrorCallback, OS))
    UnrecoverableErrorCallback(std::move(Err));
  moveToNextTable(OldOffset, LT.Prologue);
  return LT;
}